

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall
SQCompiler::ResolveBreaks(SQCompiler *this,SQFuncState *funcstate,SQInteger ntoresolve)

{
  long in_RDX;
  long in_RSI;
  SQInteger in_RDI;
  SQInteger unaff_retaddr;
  SQInteger in_stack_00000008;
  SQFuncState *in_stack_00000010;
  SQInteger pos;
  
  for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
    sqvector<long_long>::back((sqvector<long_long> *)(in_RSI + 0x48));
    sqvector<long_long>::pop_back((sqvector<long_long> *)(in_RSI + 0x48));
    SQFuncState::GetCurrentPos((SQFuncState *)0x115d3d);
    SQFuncState::SetInstructionParams
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,in_RDX);
  }
  return;
}

Assistant:

void ResolveBreaks(SQFuncState *funcstate, SQInteger ntoresolve)
    {
        while(ntoresolve > 0) {
            SQInteger pos = funcstate->_unresolvedbreaks.back();
            funcstate->_unresolvedbreaks.pop_back();
            //set the jmp instruction
            funcstate->SetInstructionParams(pos, 0, funcstate->GetCurrentPos() - pos, 0);
            ntoresolve--;
        }
    }